

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O3

void duckdb::PragmaTableInfoHelper::GetTableColumns
               (ColumnDefinition *column,ColumnConstraintInfo constraint_info,DataChunk *output,
               idx_t index)

{
  pointer pcVar1;
  column_t *pcVar2;
  string *psVar3;
  LogicalType *this;
  Value local_b0;
  string local_70;
  string local_50;
  
  pcVar2 = ColumnDefinition::Oid(column);
  Value::INTEGER(&local_b0,(int32_t)*pcVar2);
  DataChunk::SetValue(output,0,index,&local_b0);
  Value::~Value(&local_b0);
  psVar3 = ColumnDefinition::Name_abi_cxx11_(column);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + psVar3->_M_string_length);
  Value::Value(&local_b0,&local_70);
  DataChunk::SetValue(output,1,index,&local_b0);
  Value::~Value(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this = ColumnDefinition::Type(column);
  LogicalType::ToString_abi_cxx11_(&local_50,this);
  Value::Value(&local_b0,&local_50);
  DataChunk::SetValue(output,2,index,&local_b0);
  Value::~Value(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  Value::BOOLEAN(&local_b0,(bool)(constraint_info.not_null & 1));
  DataChunk::SetValue(output,3,index,&local_b0);
  Value::~Value(&local_b0);
  DefaultValue(&local_b0,column);
  DataChunk::SetValue(output,4,index,&local_b0);
  Value::~Value(&local_b0);
  Value::BOOLEAN(&local_b0,(bool)(constraint_info.pk & 1));
  DataChunk::SetValue(output,5,index,&local_b0);
  Value::~Value(&local_b0);
  return;
}

Assistant:

static void GetTableColumns(const ColumnDefinition &column, ColumnConstraintInfo constraint_info, DataChunk &output,
	                            idx_t index) {
		// return values:
		// "cid", PhysicalType::INT32
		output.SetValue(0, index, Value::INTEGER((int32_t)column.Oid()));
		// "name", PhysicalType::VARCHAR
		output.SetValue(1, index, Value(column.Name()));
		// "type", PhysicalType::VARCHAR
		output.SetValue(2, index, Value(column.Type().ToString()));
		// "notnull", PhysicalType::BOOL
		output.SetValue(3, index, Value::BOOLEAN(constraint_info.not_null));
		// "dflt_value", PhysicalType::VARCHAR
		output.SetValue(4, index, DefaultValue(column));
		// "pk", PhysicalType::BOOL
		output.SetValue(5, index, Value::BOOLEAN(constraint_info.pk));
	}